

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

st_ptls_openssl_signature_scheme_t * lookup_signature_schemes(EVP_PKEY *key)

{
  int iVar1;
  ec_key_st *key_00;
  EC_GROUP *group;
  EVP_PKEY *in_RDI;
  EC_KEY *eckey;
  st_ptls_openssl_signature_scheme_t *schemes;
  st_ptls_openssl_signature_scheme_t *local_10;
  
  local_10 = (st_ptls_openssl_signature_scheme_t *)0x0;
  iVar1 = EVP_PKEY_get_id(in_RDI);
  if (iVar1 == 6) {
    local_10 = rsa_signature_schemes;
  }
  else if (iVar1 == 0x198) {
    key_00 = EVP_PKEY_get1_EC_KEY(in_RDI);
    group = EC_KEY_get0_group(key_00);
    iVar1 = EC_GROUP_get_curve_name(group);
    if (iVar1 == 0x19f) {
      local_10 = secp256r1_signature_schemes;
    }
    else if (iVar1 == 0x2cb) {
      local_10 = secp384r1_signature_schemes;
    }
    else if (iVar1 == 0x2cc) {
      local_10 = secp521r1_signature_schemes;
    }
    EC_KEY_free(key_00);
  }
  else if (iVar1 == 0x43f) {
    local_10 = ed25519_signature_schemes;
  }
  return local_10;
}

Assistant:

static const struct st_ptls_openssl_signature_scheme_t *lookup_signature_schemes(EVP_PKEY *key)
{
    const struct st_ptls_openssl_signature_scheme_t *schemes = NULL;

    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        schemes = rsa_signature_schemes;
        break;
    case EVP_PKEY_EC: {
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(key);
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            schemes = secp256r1_signature_schemes;
            break;
#if PTLS_OPENSSL_HAVE_SECP384R1
        case NID_secp384r1:
            schemes = secp384r1_signature_schemes;
            break;
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
        case NID_secp521r1:
            schemes = secp521r1_signature_schemes;
            break;
#endif
        default:
            break;
        }
        EC_KEY_free(eckey);
    } break;
#if PTLS_OPENSSL_HAVE_ED25519
    case EVP_PKEY_ED25519:
        schemes = ed25519_signature_schemes;
        break;
#endif
    default:
        break;
    }

    return schemes;
}